

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_isel(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  TCGv_i64 ret;
  uint32_t uVar1;
  TCGv_i64 ret_00;
  TCGv_i64 c2;
  TCGv_i64 local_58;
  TCGv_i64 zr;
  TCGv_i64 t0;
  uint32_t mask;
  uint32_t bi;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar1 = rC(ctx->opcode);
  ret_00 = tcg_temp_new_i64(tcg_ctx_00);
  tcg_gen_extu_i32_i64_ppc64(tcg_ctx_00,ret_00,cpu_crf[uVar1 >> 2]);
  tcg_gen_andi_i64_ppc64(tcg_ctx_00,ret_00,ret_00,(ulong)(uint)(8 >> ((byte)uVar1 & 3)));
  c2 = tcg_const_i64_ppc64(tcg_ctx_00,0);
  uVar1 = rD(ctx->opcode);
  ret = cpu_gpr[uVar1];
  uVar1 = rA(ctx->opcode);
  local_58 = c2;
  if (uVar1 != 0) {
    uVar1 = rA(ctx->opcode);
    local_58 = cpu_gpr[uVar1];
  }
  uVar1 = rB(ctx->opcode);
  tcg_gen_movcond_i64_ppc64(tcg_ctx_00,TCG_COND_NE,ret,ret_00,c2,local_58,cpu_gpr[uVar1]);
  tcg_temp_free_i64(tcg_ctx_00,c2);
  tcg_temp_free_i64(tcg_ctx_00,ret_00);
  return;
}

Assistant:

static void gen_isel(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    uint32_t bi = rC(ctx->opcode);
    uint32_t mask = 0x08 >> (bi & 0x03);
    TCGv t0 = tcg_temp_new(tcg_ctx);
    TCGv zr;

    tcg_gen_extu_i32_tl(tcg_ctx, t0, cpu_crf[bi >> 2]);
    tcg_gen_andi_tl(tcg_ctx, t0, t0, mask);

    zr = tcg_const_tl(tcg_ctx, 0);
    tcg_gen_movcond_tl(tcg_ctx, TCG_COND_NE, cpu_gpr[rD(ctx->opcode)], t0, zr,
                       rA(ctx->opcode) ? cpu_gpr[rA(ctx->opcode)] : zr,
                       cpu_gpr[rB(ctx->opcode)]);
    tcg_temp_free(tcg_ctx, zr);
    tcg_temp_free(tcg_ctx, t0);
}